

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_cptrapcc_16(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = info->pc;
    iVar5 = (int)info->baseAddress;
    uVar3 = (ulong)(info->address_mask & uVar2 - iVar5);
    uVar4 = 0x2a;
    if (uVar3 + 2 <= info->code_len) {
      uVar4 = info->code[uVar3 + 1] & 0x2f;
    }
    info->pc = uVar2 + 2;
    uVar3 = (ulong)(info->address_mask & (uVar2 + 2) - iVar5);
    dVar6 = 2.15857280668041e-319;
    if (uVar3 + 2 <= info->code_len) {
      dVar6 = (double)(ulong)(ushort)(*(ushort *)(info->code + uVar3) << 8 |
                                     *(ushort *)(info->code + uVar3) >> 8);
    }
    info->pc = uVar2 + 4;
    MCInst_setOpcode(info->inst,0xee);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + uVar4;
    (info->extension).operands[0].type = M68K_OP_IMM;
    (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
    (info->extension).operands[0].field_0.dimm = dVar6;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cptrapcc_16(m68k_info *info)
{
	uint extension1, extension2;
	cs_m68k_op* op0;
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);
	extension2 = read_imm_16(info);

	ext = build_init_op(info, M68K_INS_FTRAPF, 1, 2);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);

	op0 = &ext->operands[0];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = extension2;
}